

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::safeSpace(JSPrinter *this)

{
  JSPrinter *this_local;
  
  if ((this->pretty & 1U) == 0) {
    this->possibleSpace = true;
  }
  else {
    emit(this,' ');
  }
  return;
}

Assistant:

void safeSpace() {
    if (pretty) {
      emit(' ');
    } else {
      possibleSpace = true;
    }
  }